

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

BasicBlock * __thiscall flow::IRBuilder::createBlock(IRBuilder *this,string *name)

{
  BasicBlock *pBVar1;
  string n;
  string local_30;
  
  makeName(&local_30,this,name);
  pBVar1 = IRHandler::createBlock(this->handler_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pBVar1;
}

Assistant:

BasicBlock* IRBuilder::createBlock(const std::string& name) {
  std::string n = makeName(name);
  return handler_->createBlock(n);
}